

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadsavemenu.cpp
# Opt level: O0

bool __thiscall DSaveMenu::MenuEvent(DSaveMenu *this,int mkey,bool fromcontroller)

{
  bool bVar1;
  FSaveGameNode **ppFVar2;
  DTextEnterMenu *this_00;
  FSaveGameNode *__src;
  DMenu *input;
  bool fromcontroller_local;
  int mkey_local;
  DSaveMenu *this_local;
  
  __src = (FSaveGameNode *)(ulong)(uint)mkey;
  bVar1 = DLoadSaveMenu::MenuEvent(&this->super_DLoadSaveMenu,mkey,fromcontroller);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else if ((this->super_DLoadSaveMenu).Selected == -1) {
    this_local._7_1_ = false;
  }
  else {
    if (mkey == 6) {
      if ((this->super_DLoadSaveMenu).Selected == 0) {
        (this->super_DLoadSaveMenu).savegamestring[0] = '\0';
      }
      else {
        ppFVar2 = TArray<FSaveGameNode_*,_FSaveGameNode_*>::operator[]
                            (&DLoadSaveMenu::SaveGames,(long)(this->super_DLoadSaveMenu).Selected);
        __src = *ppFVar2;
        strcpy((this->super_DLoadSaveMenu).savegamestring,__src->Title);
      }
      this_00 = (DTextEnterMenu *)DObject::operator_new((DObject *)0x58,(size_t)__src);
      DTextEnterMenu::DTextEnterMenu
                (this_00,(DMenu *)this,(this->super_DLoadSaveMenu).savegamestring,0x18,1,
                 fromcontroller,false);
      M_ActivateMenu((DMenu *)this_00);
      (this->super_DLoadSaveMenu).mEntering = true;
    }
    else if (mkey == 10) {
      (this->super_DLoadSaveMenu).mEntering = false;
      ppFVar2 = TArray<FSaveGameNode_*,_FSaveGameNode_*>::operator[]
                          (&DLoadSaveMenu::SaveGames,(long)(this->super_DLoadSaveMenu).Selected);
      DoSave(this,*ppFVar2);
    }
    else if (mkey == 0xb) {
      (this->super_DLoadSaveMenu).mEntering = false;
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DSaveMenu::MenuEvent (int mkey, bool fromcontroller)
{
	if (Super::MenuEvent(mkey, fromcontroller)) 
	{
		return true;
	}
	if (Selected == -1)
	{
		return false;
	}

	if (mkey == MKEY_Enter)
	{
		if (Selected != 0)
		{
			strcpy (savegamestring, SaveGames[Selected]->Title);
		}
		else
		{
			savegamestring[0] = 0;
		}
		DMenu *input = new DTextEnterMenu(this, savegamestring, SAVESTRINGSIZE, 1, fromcontroller);
		M_ActivateMenu(input);
		mEntering = true;
	}
	else if (mkey == MKEY_Input)
	{
		mEntering = false;
		DoSave(SaveGames[Selected]);
	}
	else if (mkey == MKEY_Abort)
	{
		mEntering = false;
	}
	return false;
}